

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles3::Functional::eval_bitwiseXorVecScalar_uvec2(ShaderEvalContext *c)

{
  float fVar1;
  uint uVar2;
  
  fVar1 = c->in[0].m_data[1];
  uVar2 = (uint)(long)c->in[1].m_data[0];
  (c->color).m_data[1] = (float)((uint)(long)c->in[0].m_data[3] ^ uVar2);
  (c->color).m_data[2] = (float)((uint)(long)fVar1 ^ uVar2);
  return;
}

Assistant:

inline Vector<NewT, Size> Vector<T, Size>::cast (void) const
{
	Vector<NewT, Size> res;
	for (int i = 0; i < Size; i++)
		res.m_data[i] = NewT(m_data[i]);
	return res;
}